

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O0

void __thiscall absl::lts_20250127::CondVar::Signal(CondVar *this)

{
  ulong uVar1;
  bool bVar2;
  CondVar *local_d0 [3];
  PerThreadSynch *local_b8;
  PerThreadSynch *w;
  PerThreadSynch *h;
  ulong uStack_a0;
  int c;
  intptr_t v;
  CondVar *pCStack_90;
  ScopedDisable disable_rescheduling;
  CondVar *this_local;
  memory_order __b_2;
  memory_order __b;
  memory_order __b_1;
  
  pCStack_90 = this;
  base_internal::SchedulingGuard::ScopedDisable::ScopedDisable((ScopedDisable *)((long)&v + 7));
  h._4_4_ = 0;
  std::operator&(memory_order_relaxed,__memory_order_mask);
  uStack_a0 = *(ulong *)this;
  do {
    if (uStack_a0 == 0) {
LAB_0060d705:
      base_internal::SchedulingGuard::ScopedDisable::~ScopedDisable((ScopedDisable *)((long)&v + 7))
      ;
      return;
    }
    uVar1 = uStack_a0;
    if ((uStack_a0 & 1) == 0) {
      LOCK();
      uVar1 = *(ulong *)this;
      bVar2 = uStack_a0 == uVar1;
      if (bVar2) {
        *(ulong *)this = uStack_a0 | 1;
        uVar1 = uStack_a0;
      }
      UNLOCK();
      if (bVar2) {
        w = (PerThreadSynch *)(uStack_a0 & 0xfffffffffffffffc);
        local_b8 = (PerThreadSynch *)0x0;
        if (w != (PerThreadSynch *)0x0) {
          local_b8 = w->next;
          if (local_b8 == w) {
            w = (PerThreadSynch *)0x0;
          }
          else {
            w->next = local_b8->next;
          }
        }
        uVar1 = (ulong)((uint)uStack_a0 & 2) | (ulong)w;
        std::operator&(memory_order_release,__memory_order_mask);
        *(ulong *)this = uVar1;
        if (local_b8 != (PerThreadSynch *)0x0) {
          Mutex::Fer(local_b8->waitp->cvmu,local_b8);
          local_d0[0] = this;
          base_internal::AtomicHook<void(*)(char_const*,void_const*)>::operator()
                    (lts_20250127::(anonymous_namespace)::cond_var_tracer,
                     (char (*) [14])"Signal wakeup",local_d0);
        }
        if ((uStack_a0 & 2) != 0) {
          PostSynchEvent(this,0xc);
        }
        goto LAB_0060d705;
      }
    }
    uStack_a0 = uVar1;
    h._4_4_ = synchronization_internal::MutexDelay(h._4_4_,1);
    std::operator&(memory_order_relaxed,__memory_order_mask);
    uStack_a0 = *(ulong *)this;
  } while( true );
}

Assistant:

void CondVar::Signal() {
  SchedulingGuard::ScopedDisable disable_rescheduling;
  ABSL_TSAN_MUTEX_PRE_SIGNAL(nullptr, 0);
  intptr_t v;
  int c = 0;
  for (v = cv_.load(std::memory_order_relaxed); v != 0;
       v = cv_.load(std::memory_order_relaxed)) {
    if ((v & kCvSpin) == 0 &&  // attempt to acquire spinlock
        cv_.compare_exchange_strong(v, v | kCvSpin, std::memory_order_acquire,
                                    std::memory_order_relaxed)) {
      PerThreadSynch* h = reinterpret_cast<PerThreadSynch*>(v & ~kCvLow);
      PerThreadSynch* w = nullptr;
      if (h != nullptr) {  // remove first waiter
        w = h->next;
        if (w == h) {
          h = nullptr;
        } else {
          h->next = w->next;
        }
      }
      // release spinlock
      cv_.store((v & kCvEvent) | reinterpret_cast<intptr_t>(h),
                std::memory_order_release);
      if (w != nullptr) {
        w->waitp->cvmu->Fer(w);  // wake waiter, if there was one
        cond_var_tracer("Signal wakeup", this);
      }
      if ((v & kCvEvent) != 0) {
        PostSynchEvent(this, SYNCH_EV_SIGNAL);
      }
      ABSL_TSAN_MUTEX_POST_SIGNAL(nullptr, 0);
      return;
    } else {
      c = synchronization_internal::MutexDelay(c, GENTLE);
    }
  }
  ABSL_TSAN_MUTEX_POST_SIGNAL(nullptr, 0);
}